

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_char,unsigned_char(*&)(unsigned_char,unsigned_char)>
          (Memory *this,u64 offset,u64 addend,uchar rhs,
          BinopFunc<unsigned_char,_unsigned_char> **func,uchar *out)

{
  u64 addend_00;
  u64 offset_00;
  bool bVar1;
  uchar val;
  Result RVar2;
  uchar local_41;
  uchar *puStack_40;
  uchar lhs;
  uchar *out_local;
  BinopFunc<unsigned_char,_unsigned_char> **func_local;
  u64 uStack_28;
  uchar rhs_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  puStack_40 = out;
  out_local = (uchar *)func;
  func_local._7_1_ = rhs;
  uStack_28 = addend;
  addend_local = offset;
  offset_local = (u64)this;
  RVar2 = AtomicLoad<unsigned_char>(this,offset,addend,&local_41);
  bVar1 = Failed(RVar2);
  offset_00 = addend_local;
  addend_00 = uStack_28;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    val = (**(code **)out_local)(local_41,func_local._7_1_);
    RVar2 = AtomicStore<unsigned_char>(this,offset_00,addend_00,val);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *puStack_40 = local_41;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}